

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

void __thiscall
boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on
          (reporter<boost::ext::ut::v1_1_8::printer> *this,exception exception)

{
  printer *ppVar1;
  colors *pcVar2;
  char *local_20;
  reporter<boost::ext::ut::v1_1_8::printer> *local_18;
  reporter<boost::ext::ut::v1_1_8::printer> *this_local;
  exception exception_local;
  
  local_18 = this;
  this_local = (reporter<boost::ext::ut::v1_1_8::printer> *)exception.msg;
  ppVar1 = printer::operator<<(&this->printer_,(char (*) [4])"\n  ");
  pcVar2 = printer::colors(&this->printer_);
  ppVar1 = printer::operator<<(ppVar1,&pcVar2->fail);
  ppVar1 = printer::operator<<(ppVar1,(char (*) [36])"Unexpected exception with message:\n");
  local_20 = events::exception::what((exception *)&this_local);
  ppVar1 = printer::operator<<(ppVar1,&local_20);
  pcVar2 = printer::colors(&this->printer_);
  printer::operator<<(ppVar1,&pcVar2->none);
  (this->asserts_).fail = (this->asserts_).fail + 1;
  return;
}

Assistant:

auto on(events::exception exception) -> void {
      printer_ << "\n  " << printer_.colors().fail
               << "Unexpected exception with message:\n"
               << exception.what() << printer_.colors().none;
      ++asserts_.fail;
    }